

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void S_NoiseDebug(void)

{
  FSoundChan ***pppFVar1;
  double dVar2;
  FSoundChan *pFVar3;
  uint uVar4;
  AActor *pAVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  FSoundChan *chan;
  int iVar16;
  float extraout_XMM0_Da;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  FVector3 origin;
  TVector3<float> local_78;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  char temp [32];
  
  uVar8 = CleanYfac * 0x20;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,10,0,uVar8,"*** SOUND DEBUG INFO ***",0);
  iVar16 = uVar8 + 8;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0,iVar16,"name",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x46,iVar16,"x",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x78,iVar16,"y",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xaa,iVar16,"z",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xdc,iVar16,"vol",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x104,iVar16,"dist",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,300,iVar16,"chan",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x154,iVar16,"pri",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x17c,iVar16,"flags",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x1cc,iVar16,"aud",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x208,iVar16,"pos",0);
  if (Channels != (FSoundChan *)0x0) {
    uVar8 = uVar8 | 0x10;
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    dVar2 = (pAVar5->__Pos).Y;
    pFVar3 = Channels;
    do {
      chan = pFVar3;
      pFVar3 = chan->NextChan;
    } while (chan->NextChan != (FSoundChan *)0x0);
    local_68 = (float)(pAVar5->__Pos).X;
    fStack_64 = (float)(pAVar5->__Pos).Z;
    uStack_60 = 0;
    do {
      if ((screen->super_DSimpleCanvas).super_DCanvas.Height + -0x10 <= (int)uVar8) break;
      CalcPosVel(chan,&origin,(FVector3 *)0x0);
      iVar16 = ((uint)chan->ChanFlags >> 7 & 2) + 2;
      FWadCollection::GetLumpName(&Wads,temp,S_sfx.Array[(chan->SoundID).ID].lumpnum);
      temp[8] = '\0';
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0,uVar8,temp,0);
      if ((chan->ChanFlags & 1) == 0) {
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x46,uVar8,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x78,uVar8,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0xaa,uVar8,"---",0);
        pcVar6 = "---";
      }
      else {
        mysnprintf(temp,0x20,"%.0f",(double)origin.X);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x46,uVar8,temp,0);
        mysnprintf(temp,0x20,"%.0f",(double)origin.Z);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x78,uVar8,temp,0);
        mysnprintf(temp,0x20,"%.0f",(double)origin.Y);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0xaa,uVar8,temp,0);
        pcVar6 = "---";
        if (0.0 < (chan->super_FISoundChannel).DistanceScale) {
          local_78.Z = origin.Z - (float)dVar2;
          local_78.X = origin.X - local_68;
          local_78.Y = origin.Y - fStack_64;
          TVector3<float>::Length(&local_78);
          mysnprintf(temp,0x20,"%.0f");
          pcVar6 = temp;
        }
      }
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x104,uVar8,pcVar6,0);
      mysnprintf(temp,0x20,"%.2g",(double)chan->Volume);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0xdc,uVar8,temp,0);
      mysnprintf(temp,0x20,"%d",(ulong)chan->EntChannel);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,300,uVar8,temp,0);
      mysnprintf(temp,0x20,"%d",(ulong)(uint)(int)chan->Priority);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x154,uVar8,temp,0);
      uVar4 = chan->ChanFlags;
      pcVar6 = "\x1cD";
      pcVar15 = "\x1cD";
      if ((uVar4 & 1) == 0) {
        pcVar15 = "\x1cM";
      }
      auVar18._0_4_ = -(uint)((uVar4 & 0x40) == 0);
      auVar18._4_4_ = -(uint)((uVar4 & 0x10) == 0);
      auVar18._8_4_ = -(uint)((uVar4 & 0x20) == 0);
      auVar18._12_4_ = -(uint)((uVar4 & 8) == 0);
      auVar17._0_4_ = -(uint)((uVar4 & 0x800) == 0);
      auVar17._4_4_ = -(uint)((uVar4 & 2) == 0);
      auVar17._8_4_ = -(uint)((uVar4 & 0x100) == 0);
      auVar17._12_4_ = -(uint)((uVar4 & 0x80) == 0);
      auVar18 = packssdw(auVar17,auVar18);
      auVar18 = packsswb(auVar18,auVar18);
      pcVar11 = "\x1cD";
      if ((auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar11 = "\x1cM";
      }
      pcVar12 = "\x1cD";
      if ((auVar18 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar12 = "\x1cM";
      }
      pcVar7 = "\x1cD";
      if ((auVar18 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar7 = "\x1cM";
      }
      pcVar9 = "\x1cD";
      if ((auVar18 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar9 = "\x1cM";
      }
      pcVar10 = "\x1cD";
      if ((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar10 = "\x1cM";
      }
      pcVar13 = "\x1cD";
      if ((auVar18 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "\x1cM";
      }
      pcVar14 = "\x1cD";
      if ((auVar18 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "\x1cM";
      }
      if ((auVar18 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar6 = "\x1cM";
      }
      mysnprintf(temp,0x20,"%s3%sZ%sU%sM%sN%sA%sL%sE%sV",pcVar15,pcVar11,pcVar12,pcVar7,pcVar9,
                 pcVar10,pcVar13,pcVar14,pcVar6);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x17c,uVar8,temp,0);
      (*GSnd->_vptr_SoundRenderer[0x14])(GSnd,chan);
      mysnprintf(temp,0x20,"%.4f",(double)extraout_XMM0_Da);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x1cc,uVar8,temp,0);
      uVar4 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,chan);
      mysnprintf(temp,0x20,"%u",(ulong)uVar4);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar16,0x208,uVar8,temp,0);
      uVar8 = uVar8 + 8;
      pppFVar1 = &chan->PrevChan;
      chan = (FSoundChan *)(*pppFVar1 + -5);
    } while (*pppFVar1 != &Channels);
    V_SetBorderNeedRefresh();
  }
  return;
}

Assistant:

void S_NoiseDebug (void)
{
	FSoundChan *chan;
	FVector3 listener;
	FVector3 origin;
	int y, color;

	y = 32 * CleanYfac;
	screen->DrawText (SmallFont, CR_YELLOW, 0, y, "*** SOUND DEBUG INFO ***", TAG_DONE);
	y += 8;

	screen->DrawText (SmallFont, CR_GOLD, 0, y, "name", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 70, y, "x", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 120, y, "y", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 170, y, "z", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 220, y, "vol", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 260, y, "dist", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 300, y, "chan", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 340, y, "pri", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 380, y, "flags", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 460, y, "aud", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 520, y, "pos", TAG_DONE);
	y += 8;

	if (Channels == NULL)
	{
		return;
	}


	listener = players[consoleplayer].camera->SoundPos();

	// Display the oldest channel first.
	for (chan = Channels; chan->NextChan != NULL; chan = chan->NextChan)
	{ }
	while (y < SCREENHEIGHT - 16)
	{
		char temp[32];

		CalcPosVel(chan, &origin, NULL);
		color = (chan->ChanFlags & CHAN_LOOP) ? CR_BROWN : CR_GREY;

		// Name
		Wads.GetLumpName (temp, S_sfx[chan->SoundID].lumpnum);
		temp[8] = 0;
		screen->DrawText (SmallFont, color, 0, y, temp, TAG_DONE);

		if (!(chan->ChanFlags & CHAN_IS3D))
		{
			screen->DrawText(SmallFont, color, 70, y, "---", TAG_DONE);		// X
			screen->DrawText(SmallFont, color, 120, y, "---", TAG_DONE);	// Y
			screen->DrawText(SmallFont, color, 170, y, "---", TAG_DONE);	// Z
			screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);	// Distance
		}
		else
		{
			// X coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.X);
			screen->DrawText(SmallFont, color, 70, y, temp, TAG_DONE);

			// Y coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Z);
			screen->DrawText(SmallFont, color, 120, y, temp, TAG_DONE);

			// Z coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Y);
			screen->DrawText(SmallFont, color, 170, y, temp, TAG_DONE);

			// Distance
			if (chan->DistanceScale > 0)
			{
				mysnprintf(temp, countof(temp), "%.0f", (origin - listener).Length());
				screen->DrawText(SmallFont, color, 260, y, temp, TAG_DONE);
			}
			else
			{
				screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);
			}
		}

		// Volume
		mysnprintf(temp, countof(temp), "%.2g", chan->Volume);
		screen->DrawText(SmallFont, color, 220, y, temp, TAG_DONE);

		// Channel
		mysnprintf(temp, countof(temp), "%d", chan->EntChannel);
		screen->DrawText(SmallFont, color, 300, y, temp, TAG_DONE);

		// Priority
		mysnprintf(temp, countof(temp), "%d", chan->Priority);
		screen->DrawText(SmallFont, color, 340, y, temp, TAG_DONE);

		// Flags
		mysnprintf(temp, countof(temp), "%s3%sZ%sU%sM%sN%sA%sL%sE%sV",
			(chan->ChanFlags & CHAN_IS3D)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LISTENERZ)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_UI)				? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_MAYBE_LOCAL)	? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_NOPAUSE)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_AREA)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LOOP)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_EVICTED)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_VIRTUAL)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK);
		screen->DrawText(SmallFont, color, 380, y, temp, TAG_DONE);

		// Audibility
		mysnprintf(temp, countof(temp), "%.4f", GSnd->GetAudibility(chan));
		screen->DrawText(SmallFont, color, 460, y, temp, TAG_DONE);

		// Position
		mysnprintf(temp, countof(temp), "%u", GSnd->GetPosition(chan));
		screen->DrawText(SmallFont, color, 520, y, temp, TAG_DONE);


		y += 8;
		if (chan->PrevChan == &Channels)
		{
			break;
		}
		chan = (FSoundChan *)((size_t)chan->PrevChan - myoffsetof(FSoundChan, NextChan));
	}
	V_SetBorderNeedRefresh();
}